

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * __thiscall
spvtools::opt::analysis::Matrix::str_abi_cxx11_(string *__return_storage_ptr__,Matrix *this)

{
  ostream *poVar1;
  string local_1b0 [32];
  ostringstream local_190 [8];
  ostringstream oss;
  Matrix *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"<");
  (*this->element_type_->_vptr_Type[3])(local_1b0);
  poVar1 = std::operator<<(poVar1,local_1b0);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->count_);
  std::operator<<(poVar1,">");
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string Matrix::str() const {
  std::ostringstream oss;
  oss << "<" << element_type_->str() << ", " << count_ << ">";
  return oss.str();
}